

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

double luby(double y,int x)

{
  double dVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int seq;
  int size;
  int x_local;
  double y_local;
  
  local_1c = 0;
  for (local_18 = 1; seq = x, local_18 < x + 1; local_18 = local_18 * 2 + 1) {
    local_1c = local_1c + 1;
  }
  for (; local_18 + -1 != seq; seq = seq % local_18) {
    local_18 = local_18 + -1 >> 1;
    local_1c = local_1c + -1;
  }
  dVar1 = pow(y,(double)local_1c);
  return dVar1;
}

Assistant:

double luby(double y, int x)
{
    int size, seq;
    for (size = 1, seq = 0; size < x+1; seq++, size = 2*size + 1);
    while (size-1 != x){
        size = (size-1) >> 1;
        seq--;
        x = x % size;
    }
    return pow(y, (double)seq);
}